

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *
nonius::detail::measure_environment<std::chrono::_V2::system_clock>
          (environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
           *__return_storage_ptr__,reporter *rep)

{
  uint iterations;
  environment_estimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> cost;
  environment_estimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> resolution;
  environment_estimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> local_68;
  environment_estimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> local_48;
  
  (*rep->_vptr_reporter[4])(rep);
  iterations = warmup<std::chrono::_V2::system_clock>();
  (*rep->_vptr_reporter[5])(rep,(ulong)iterations);
  (*rep->_vptr_reporter[6])(rep);
  estimate_clock_resolution<std::chrono::_V2::system_clock>(&local_48,iterations);
  (*rep->_vptr_reporter[7])(rep);
  (*rep->_vptr_reporter[8])(rep);
  estimate_clock_cost<std::chrono::_V2::system_clock>
            (&local_68,(FloatDuration<std::chrono::_V2::system_clock>)local_48.mean.__r);
  (*rep->_vptr_reporter[9])(rep);
  (__return_storage_ptr__->clock_resolution).outliers.low_severe = local_48.outliers.low_severe;
  (__return_storage_ptr__->clock_resolution).outliers.low_mild = local_48.outliers.low_mild;
  (__return_storage_ptr__->clock_resolution).outliers.high_mild = local_48.outliers.high_mild;
  (__return_storage_ptr__->clock_resolution).outliers.high_severe = local_48.outliers.high_severe;
  (__return_storage_ptr__->clock_resolution).mean.__r = local_48.mean.__r;
  (__return_storage_ptr__->clock_resolution).outliers.samples_seen = local_48.outliers.samples_seen;
  (__return_storage_ptr__->clock_resolution).outliers.low_severe = local_48.outliers.low_severe;
  (__return_storage_ptr__->clock_cost).mean.__r = local_68.mean.__r;
  (__return_storage_ptr__->clock_cost).outliers.samples_seen = local_68.outliers.samples_seen;
  (__return_storage_ptr__->clock_cost).outliers.low_severe = local_68.outliers.low_severe;
  (__return_storage_ptr__->clock_cost).outliers.low_severe = local_68.outliers.low_severe;
  (__return_storage_ptr__->clock_cost).outliers.low_mild = local_68.outliers.low_mild;
  (__return_storage_ptr__->clock_cost).outliers.high_mild = local_68.outliers.high_mild;
  (__return_storage_ptr__->clock_cost).outliers.high_severe = local_68.outliers.high_severe;
  return __return_storage_ptr__;
}

Assistant:

environment<FloatDuration<Clock>> measure_environment(reporter& rep) {
            rep.warmup_start();
            auto iters = detail::warmup<Clock>();
            rep.warmup_end(iters);

            rep.estimate_clock_resolution_start();
            auto resolution = detail::estimate_clock_resolution<Clock>(iters);
            rep.estimate_clock_resolution_complete(resolution);

            rep.estimate_clock_cost_start();
            auto cost = detail::estimate_clock_cost<Clock>(resolution.mean);
            rep.estimate_clock_cost_complete(cost);

            return { resolution, cost };
        }